

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Buffer::SaveDataAll(Buffer *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  for (p_Var2 = (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->Occupy_Block;
      p_Var2 = p_Var2->_M_next) {
    iVar1 = *(int *)&p_Var2[1]._M_next;
    Block::WriteFile(this->buffer + iVar1);
    this->Dirty[iVar1] = 0;
  }
  return;
}

Assistant:

void Buffer::SaveDataAll(void) {
	list<int>::iterator it;
	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
		this->SaveData(*it);
	}
}